

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_contour.cpp
# Opt level: O3

void __thiscall agg::vcgen_contour::rewind(vcgen_contour *this,FILE *__stream)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (this->m_status == initial) {
    vertex_sequence<agg::vertex_dist,_6U>::close(&this->m_src_vertices,1);
    uVar1 = this->m_orientation;
    if (((uVar1 & 0x30) == 0 & this->m_auto_detect) == 1) {
      dVar2 = calc_polygon_area<agg::vertex_sequence<agg::vertex_dist,6u>>(&this->m_src_vertices);
      uVar1 = (uint)(dVar2 <= 0.0) * 0x10 + 0x10;
      this->m_orientation = uVar1;
    }
    if ((uVar1 & 0x30) != 0) {
      dVar2 = this->m_width;
      if ((uVar1 & 0x10) == 0) {
        dVar2 = -dVar2;
      }
      dVar2 = dVar2 * 0.5;
      dVar3 = -dVar2;
      (this->m_stroker).m_width = dVar2;
      dVar4 = dVar3;
      if (dVar3 <= dVar2) {
        dVar4 = dVar2;
      }
      (this->m_stroker).m_width_abs = dVar4;
      (this->m_stroker).m_width_sign = (uint)(dVar3 <= dVar2) * 2 + -1;
      (this->m_stroker).m_width_eps = dVar2 * 0.0009765625;
    }
  }
  this->m_status = ready;
  this->m_src_vertex = 0;
  return;
}

Assistant:

void vcgen_contour::rewind(unsigned)
    {
        if(m_status == initial)
        {
            m_src_vertices.close(true);
            if(m_auto_detect)
            {
                if(!is_oriented(m_orientation))
                {
                    m_orientation = (calc_polygon_area(m_src_vertices) > 0.0) ? 
                                    path_flags_ccw : 
                                    path_flags_cw;
                }
            }
            if(is_oriented(m_orientation))
            {
                m_stroker.width(is_ccw(m_orientation) ? m_width : -m_width);
            }
        }
        m_status = ready;
        m_src_vertex = 0;
    }